

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O2

HighsDebugStatus __thiscall
HSimplexNla::debugReportInvertSolutionError
          (HSimplexNla *this,bool transposed,HVector *true_solution,HVector *solution,
          HVector *residual,bool force)

{
  uint uVar1;
  HighsDebugStatus HVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  allocator local_51;
  double local_50;
  double local_48;
  string local_40;
  
  uVar1 = this->lp_->num_row_;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  local_48 = 0.0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar5 = ABS((solution->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4] -
                (true_solution->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4]);
    if (local_48 <= dVar5) {
      local_48 = dVar5;
    }
  }
  local_50 = debugInvertResidualError(this,transposed,solution,residual);
  std::__cxx11::string::string((string *)&local_40,"random solution",&local_51);
  HVar2 = debugReportInvertSolutionError(this,&local_40,transposed,local_48,local_50,force);
  std::__cxx11::string::~string((string *)&local_40);
  return HVar2;
}

Assistant:

HighsDebugStatus HSimplexNla::debugReportInvertSolutionError(
    const bool transposed, const HVector& true_solution,
    const HVector& solution, HVector& residual, const bool force) const {
  const HighsInt num_row = this->lp_->num_row_;
  double solve_error_norm = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double solve_error = fabs(solution.array[iRow] - true_solution.array[iRow]);
    solve_error_norm = std::max(solve_error, solve_error_norm);
  }
  double residual_error_norm =
      debugInvertResidualError(transposed, solution, residual);

  return debugReportInvertSolutionError("random solution", transposed,
                                        solve_error_norm, residual_error_norm,
                                        force);
}